

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  Scene *pSVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 (*pauVar32) [16];
  uint uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  undefined4 uVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar93;
  float fVar94;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar99;
  undefined1 auVar100 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [32];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar134 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_153c;
  ulong local_1538;
  ulong local_1530;
  RayHit *local_1528;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  long local_14e0;
  long local_14d8;
  RTCFilterFunctionNArguments local_14d0;
  undefined8 local_14a0;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  float local_1470;
  float local_146c;
  float local_1468;
  undefined4 local_1464;
  undefined4 local_1460;
  undefined4 local_145c;
  uint local_1458;
  uint local_1454;
  uint local_1450;
  undefined1 local_1440 [32];
  undefined1 local_1410 [16];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  float local_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [8];
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [32];
  undefined4 local_1100;
  undefined4 uStack_10fc;
  undefined4 uStack_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined4 uStack_10e8;
  undefined4 uStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar75;
  float fVar76;
  float fVar77;
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar42 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar78._8_4_ = 0x7fffffff;
    auVar78._0_8_ = 0x7fffffff7fffffff;
    auVar78._12_4_ = 0x7fffffff;
    auVar78 = vandps_avx((undefined1  [16])aVar1,auVar78);
    auVar86._8_4_ = 0x219392ef;
    auVar86._0_8_ = 0x219392ef219392ef;
    auVar86._12_4_ = 0x219392ef;
    auVar78 = vcmpps_avx(auVar78,auVar86,1);
    auVar87._8_4_ = 0x3f800000;
    auVar87._0_8_ = 0x3f8000003f800000;
    auVar87._12_4_ = 0x3f800000;
    auVar86 = vdivps_avx(auVar87,(undefined1  [16])aVar1);
    auVar88._8_4_ = 0x5d5e0b6b;
    auVar88._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar88._12_4_ = 0x5d5e0b6b;
    auVar78 = vblendvps_avx(auVar86,auVar88,auVar78);
    auVar79._0_4_ = auVar78._0_4_ * 0.99999964;
    auVar79._4_4_ = auVar78._4_4_ * 0.99999964;
    auVar79._8_4_ = auVar78._8_4_ * 0.99999964;
    auVar79._12_4_ = auVar78._12_4_ * 0.99999964;
    auVar67._0_4_ = auVar78._0_4_ * 1.0000004;
    auVar67._4_4_ = auVar78._4_4_ * 1.0000004;
    auVar67._8_4_ = auVar78._8_4_ * 1.0000004;
    auVar67._12_4_ = auVar78._12_4_ * 1.0000004;
    uVar47 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1330._4_4_ = uVar47;
    local_1330._0_4_ = uVar47;
    local_1330._8_4_ = uVar47;
    local_1330._12_4_ = uVar47;
    auVar110 = ZEXT1664(local_1330);
    uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1340._4_4_ = uVar47;
    local_1340._0_4_ = uVar47;
    local_1340._8_4_ = uVar47;
    local_1340._12_4_ = uVar47;
    auVar117 = ZEXT1664(local_1340);
    uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1350._4_4_ = uVar47;
    local_1350._0_4_ = uVar47;
    local_1350._8_4_ = uVar47;
    local_1350._12_4_ = uVar47;
    auVar121 = ZEXT1664(local_1350);
    auVar78 = vmovshdup_avx(auVar79);
    local_1370 = vshufps_avx(auVar79,auVar79,0x55);
    auVar127 = ZEXT1664(local_1370);
    auVar86 = vshufpd_avx(auVar79,auVar79,1);
    local_1380 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar128 = ZEXT1664(local_1380);
    local_13a0 = vshufps_avx(auVar67,auVar67,0x55);
    auVar134 = ZEXT1664(local_13a0);
    uVar40 = (ulong)(auVar79._0_4_ < 0.0) << 4;
    uVar41 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x20;
    local_13b0 = vshufps_avx(auVar67,auVar67,0xaa);
    auVar142 = ZEXT1664(local_13b0);
    uVar39 = (ulong)(auVar86._0_4_ < 0.0) << 4 | 0x40;
    uVar43 = uVar40 ^ 0x10;
    uVar46 = uVar41 ^ 0x10;
    uVar47 = auVar54._0_4_;
    local_1410._4_4_ = uVar47;
    local_1410._0_4_ = uVar47;
    local_1410._8_4_ = uVar47;
    local_1410._12_4_ = uVar47;
    auVar101 = ZEXT1664(local_1410);
    uVar47 = auVar59._0_4_;
    auVar53 = ZEXT1664(CONCAT412(uVar47,CONCAT48(uVar47,CONCAT44(uVar47,uVar47))));
    local_1120._16_16_ = mm_lookupmask_ps._240_16_;
    local_1120._0_16_ = mm_lookupmask_ps._0_16_;
    auVar51._8_4_ = 0x3f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    auVar51._12_4_ = 0x3f800000;
    auVar51._16_4_ = 0x3f800000;
    auVar51._20_4_ = 0x3f800000;
    auVar51._24_4_ = 0x3f800000;
    auVar51._28_4_ = 0x3f800000;
    auVar50._8_4_ = 0xbf800000;
    auVar50._0_8_ = 0xbf800000bf800000;
    auVar50._12_4_ = 0xbf800000;
    auVar50._16_4_ = 0xbf800000;
    auVar50._20_4_ = 0xbf800000;
    auVar50._24_4_ = 0xbf800000;
    auVar50._28_4_ = 0xbf800000;
    _local_1140 = vblendvps_avx(auVar51,auVar50,local_1120);
    local_1528 = ray;
    local_1530 = uVar40;
    local_1538 = uVar41;
    local_1360 = auVar79._0_4_;
    fStack_135c = auVar79._0_4_;
    fStack_1358 = auVar79._0_4_;
    fStack_1354 = auVar79._0_4_;
    local_1390 = auVar67._0_4_;
    fStack_138c = auVar67._0_4_;
    fStack_1388 = auVar67._0_4_;
    fStack_1384 = auVar67._0_4_;
    fVar124 = auVar79._0_4_;
    fVar125 = auVar79._0_4_;
    fVar126 = auVar79._0_4_;
    fVar130 = auVar67._0_4_;
    fVar131 = auVar67._0_4_;
    fVar132 = auVar67._0_4_;
LAB_01490acb:
    if (pauVar42 != (undefined1 (*) [16])&local_fa0) {
      pauVar32 = pauVar42 + -1;
      pauVar42 = pauVar42 + -1;
      if (*(float *)(*pauVar32 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar45 = *(ulong *)*pauVar42;
        while ((uVar45 & 8) == 0) {
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar40),auVar110._0_16_);
          auVar54._0_4_ = auVar79._0_4_ * auVar78._0_4_;
          auVar54._4_4_ = fVar124 * auVar78._4_4_;
          auVar54._8_4_ = fVar125 * auVar78._8_4_;
          auVar54._12_4_ = fVar126 * auVar78._12_4_;
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar41),auVar117._0_16_);
          auVar59._0_4_ = auVar127._0_4_ * auVar78._0_4_;
          auVar59._4_4_ = auVar127._4_4_ * auVar78._4_4_;
          auVar59._8_4_ = auVar127._8_4_ * auVar78._8_4_;
          auVar59._12_4_ = auVar127._12_4_ * auVar78._12_4_;
          auVar78 = vmaxps_avx(auVar54,auVar59);
          auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar39),auVar121._0_16_);
          auVar60._0_4_ = auVar128._0_4_ * auVar86._0_4_;
          auVar60._4_4_ = auVar128._4_4_ * auVar86._4_4_;
          auVar60._8_4_ = auVar128._8_4_ * auVar86._8_4_;
          auVar60._12_4_ = auVar128._12_4_ * auVar86._12_4_;
          auVar86 = vmaxps_avx(auVar60,auVar101._0_16_);
          local_1300 = vmaxps_avx(auVar78,auVar86);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar43),auVar110._0_16_);
          auVar61._0_4_ = auVar67._0_4_ * auVar78._0_4_;
          auVar61._4_4_ = fVar130 * auVar78._4_4_;
          auVar61._8_4_ = fVar131 * auVar78._8_4_;
          auVar61._12_4_ = fVar132 * auVar78._12_4_;
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + uVar46),auVar117._0_16_);
          auVar68._0_4_ = auVar134._0_4_ * auVar78._0_4_;
          auVar68._4_4_ = auVar134._4_4_ * auVar78._4_4_;
          auVar68._8_4_ = auVar134._8_4_ * auVar78._8_4_;
          auVar68._12_4_ = auVar134._12_4_ * auVar78._12_4_;
          auVar78 = vminps_avx(auVar61,auVar68);
          auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar45 + 0x20 + (uVar39 ^ 0x10)),
                               auVar121._0_16_);
          auVar69._0_4_ = auVar142._0_4_ * auVar86._0_4_;
          auVar69._4_4_ = auVar142._4_4_ * auVar86._4_4_;
          auVar69._8_4_ = auVar142._8_4_ * auVar86._8_4_;
          auVar69._12_4_ = auVar142._12_4_ * auVar86._12_4_;
          auVar86 = vminps_avx(auVar69,auVar53._0_16_);
          auVar78 = vminps_avx(auVar78,auVar86);
          auVar78 = vcmpps_avx(local_1300,auVar78,2);
          uVar33 = vmovmskps_avx(auVar78);
          if (uVar33 == 0) goto LAB_01490acb;
          uVar33 = uVar33 & 0xff;
          uVar44 = uVar45 & 0xfffffffffffffff0;
          lVar15 = 0;
          for (uVar45 = (ulong)uVar33; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000)
          {
            lVar15 = lVar15 + 1;
          }
          uVar45 = *(ulong *)(uVar44 + lVar15 * 8);
          uVar33 = uVar33 - 1 & uVar33;
          uVar37 = (ulong)uVar33;
          if (uVar33 != 0) {
            uVar36 = *(uint *)(local_1300 + lVar15 * 4);
            lVar15 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar38 = (ulong)uVar33;
            uVar37 = *(ulong *)(uVar44 + lVar15 * 8);
            uVar35 = *(uint *)(local_1300 + lVar15 * 4);
            if (uVar33 == 0) {
              if (uVar36 < uVar35) {
                *(ulong *)*pauVar42 = uVar37;
                *(uint *)(*pauVar42 + 8) = uVar35;
                pauVar42 = pauVar42 + 1;
              }
              else {
                *(ulong *)*pauVar42 = uVar45;
                *(uint *)(*pauVar42 + 8) = uVar36;
                pauVar42 = pauVar42 + 1;
                uVar45 = uVar37;
              }
            }
            else {
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar45;
              auVar78 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar36));
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar37;
              auVar86 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar35));
              lVar15 = 0;
              for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar45 = (ulong)uVar33;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = *(ulong *)(uVar44 + lVar15 * 8);
              auVar59 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_1300 + lVar15 * 4)));
              auVar54 = vpcmpgtd_avx(auVar86,auVar78);
              if (uVar33 == 0) {
                auVar87 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar86,auVar78,auVar87);
                auVar78 = vblendvps_avx(auVar78,auVar86,auVar87);
                auVar86 = vpcmpgtd_avx(auVar59,auVar54);
                auVar87 = vpshufd_avx(auVar86,0xaa);
                auVar86 = vblendvps_avx(auVar59,auVar54,auVar87);
                auVar54 = vblendvps_avx(auVar54,auVar59,auVar87);
                auVar59 = vpcmpgtd_avx(auVar54,auVar78);
                auVar87 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar54,auVar78,auVar87);
                auVar78 = vblendvps_avx(auVar78,auVar54,auVar87);
                *pauVar42 = auVar78;
                pauVar42[1] = auVar59;
                uVar45 = auVar86._0_8_;
                pauVar42 = pauVar42 + 2;
              }
              else {
                lVar15 = 0;
                for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                  lVar15 = lVar15 + 1;
                }
                auVar89._8_8_ = 0;
                auVar89._0_8_ = *(ulong *)(uVar44 + lVar15 * 8);
                auVar88 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_1300 + lVar15 * 4)));
                auVar87 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar86,auVar78,auVar87);
                auVar78 = vblendvps_avx(auVar78,auVar86,auVar87);
                auVar86 = vpcmpgtd_avx(auVar88,auVar59);
                auVar87 = vpshufd_avx(auVar86,0xaa);
                auVar86 = vblendvps_avx(auVar88,auVar59,auVar87);
                auVar59 = vblendvps_avx(auVar59,auVar88,auVar87);
                auVar87 = vpcmpgtd_avx(auVar59,auVar78);
                auVar88 = vpshufd_avx(auVar87,0xaa);
                auVar87 = vblendvps_avx(auVar59,auVar78,auVar88);
                auVar78 = vblendvps_avx(auVar78,auVar59,auVar88);
                auVar59 = vpcmpgtd_avx(auVar86,auVar54);
                auVar88 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar86,auVar54,auVar88);
                auVar86 = vblendvps_avx(auVar54,auVar86,auVar88);
                auVar54 = vpcmpgtd_avx(auVar87,auVar86);
                auVar88 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar87,auVar86,auVar88);
                auVar86 = vblendvps_avx(auVar86,auVar87,auVar88);
                *pauVar42 = auVar78;
                pauVar42[1] = auVar86;
                pauVar42[2] = auVar54;
                auVar101 = ZEXT1664(local_1410);
                uVar45 = auVar59._0_8_;
                pauVar42 = pauVar42 + 3;
              }
            }
          }
        }
        local_14e0 = (ulong)((uint)uVar45 & 0xf) - 8;
        uVar45 = uVar45 & 0xfffffffffffffff0;
        for (local_14d8 = 0; local_14d8 != local_14e0; local_14d8 = local_14d8 + 1) {
          lVar34 = local_14d8 * 0x60;
          pSVar2 = context->scene;
          ppfVar3 = (pSVar2->vertices).items;
          pfVar4 = ppfVar3[*(uint *)(uVar45 + 0x40 + lVar34)];
          auVar63._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x20 + lVar34));
          auVar63._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + lVar34));
          pfVar5 = ppfVar3[*(uint *)(uVar45 + 0x48 + lVar34)];
          auVar71._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + 0x28 + lVar34));
          auVar71._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + 8 + lVar34));
          pfVar6 = ppfVar3[*(uint *)(uVar45 + 0x44 + lVar34)];
          auVar90._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x24 + lVar34));
          auVar90._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 4 + lVar34));
          pfVar7 = ppfVar3[*(uint *)(uVar45 + 0x4c + lVar34)];
          auVar118._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x2c + lVar34));
          auVar118._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0xc + lVar34));
          lVar15 = uVar45 + 0x40 + lVar34;
          local_fc0 = *(undefined8 *)(lVar15 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar15 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          lVar15 = uVar45 + 0x50 + lVar34;
          local_1320 = *(undefined8 *)(lVar15 + 0x10);
          uStack_1318 = *(undefined8 *)(lVar15 + 0x18);
          auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x10 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar45 + 0x18 + lVar34)));
          auVar78 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x10 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar45 + 0x18 + lVar34)));
          auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x14 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar45 + 0x1c + lVar34)));
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x14 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar45 + 0x1c + lVar34)));
          auVar67 = vunpcklps_avx(auVar78,auVar86);
          auVar79 = vunpcklps_avx(auVar54,auVar59);
          auVar78 = vunpckhps_avx(auVar54,auVar59);
          auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x30 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar45 + 0x38 + lVar34)));
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x30 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar45 + 0x38 + lVar34)));
          auVar87 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x34 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar45 + 0x3c + lVar34)));
          auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x34 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar45 + 0x3c + lVar34)));
          auVar54 = vunpcklps_avx(auVar86,auVar54);
          auVar88 = vunpcklps_avx(auVar59,auVar87);
          auVar86 = vunpckhps_avx(auVar59,auVar87);
          uStack_1310 = local_1320;
          uStack_1308 = uStack_1318;
          auVar50 = vunpcklps_avx(auVar90,auVar118);
          auVar51 = vunpcklps_avx(auVar63,auVar71);
          auVar14 = vunpcklps_avx(auVar51,auVar50);
          auVar50 = vunpckhps_avx(auVar51,auVar50);
          auVar51 = vunpckhps_avx(auVar90,auVar118);
          auVar74 = vunpckhps_avx(auVar63,auVar71);
          auVar51 = vunpcklps_avx(auVar74,auVar51);
          auVar122._16_16_ = auVar79;
          auVar122._0_16_ = auVar79;
          auVar91._16_16_ = auVar78;
          auVar91._0_16_ = auVar78;
          auVar108._16_16_ = auVar67;
          auVar108._0_16_ = auVar67;
          auVar141._16_16_ = auVar88;
          auVar141._0_16_ = auVar88;
          auVar80._16_16_ = auVar86;
          auVar80._0_16_ = auVar86;
          uVar47 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar111._4_4_ = uVar47;
          auVar111._0_4_ = uVar47;
          auVar111._8_4_ = uVar47;
          auVar111._12_4_ = uVar47;
          auVar111._16_4_ = uVar47;
          auVar111._20_4_ = uVar47;
          auVar111._24_4_ = uVar47;
          auVar111._28_4_ = uVar47;
          uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar119._4_4_ = uVar47;
          auVar119._0_4_ = uVar47;
          auVar119._8_4_ = uVar47;
          auVar119._12_4_ = uVar47;
          auVar119._16_4_ = uVar47;
          auVar119._20_4_ = uVar47;
          auVar119._24_4_ = uVar47;
          auVar119._28_4_ = uVar47;
          auVar48._16_16_ = auVar54;
          auVar48._0_16_ = auVar54;
          uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar129._4_4_ = uVar47;
          auVar129._0_4_ = uVar47;
          auVar129._8_4_ = uVar47;
          auVar129._12_4_ = uVar47;
          auVar129._16_4_ = uVar47;
          auVar129._20_4_ = uVar47;
          auVar129._24_4_ = uVar47;
          auVar129._28_4_ = uVar47;
          local_13e0 = vsubps_avx(auVar14,auVar111);
          local_1400 = vsubps_avx(auVar50,auVar119);
          local_fe0 = vsubps_avx(auVar51,auVar129);
          auVar50 = vsubps_avx(auVar122,auVar111);
          auVar51 = vsubps_avx(auVar91,auVar119);
          auVar74 = vsubps_avx(auVar108,auVar129);
          auVar14 = vsubps_avx(auVar141,auVar111);
          auVar63 = vsubps_avx(auVar80,auVar119);
          auVar12 = vsubps_avx(auVar48,auVar129);
          local_1000 = vsubps_avx(auVar14,local_13e0);
          local_1040 = vsubps_avx(auVar63,local_1400);
          local_1020 = vsubps_avx(auVar12,local_fe0);
          auVar49._0_4_ = auVar14._0_4_ + local_13e0._0_4_;
          auVar49._4_4_ = auVar14._4_4_ + local_13e0._4_4_;
          auVar49._8_4_ = auVar14._8_4_ + local_13e0._8_4_;
          auVar49._12_4_ = auVar14._12_4_ + local_13e0._12_4_;
          auVar49._16_4_ = auVar14._16_4_ + local_13e0._16_4_;
          auVar49._20_4_ = auVar14._20_4_ + local_13e0._20_4_;
          auVar49._24_4_ = auVar14._24_4_ + local_13e0._24_4_;
          auVar49._28_4_ = auVar14._28_4_ + local_13e0._28_4_;
          auVar64._0_4_ = local_1400._0_4_ + auVar63._0_4_;
          auVar64._4_4_ = local_1400._4_4_ + auVar63._4_4_;
          auVar64._8_4_ = local_1400._8_4_ + auVar63._8_4_;
          auVar64._12_4_ = local_1400._12_4_ + auVar63._12_4_;
          auVar64._16_4_ = local_1400._16_4_ + auVar63._16_4_;
          auVar64._20_4_ = local_1400._20_4_ + auVar63._20_4_;
          auVar64._24_4_ = local_1400._24_4_ + auVar63._24_4_;
          auVar64._28_4_ = local_1400._28_4_ + auVar63._28_4_;
          fVar124 = local_fe0._0_4_;
          auVar81._0_4_ = auVar12._0_4_ + fVar124;
          fVar125 = local_fe0._4_4_;
          auVar81._4_4_ = auVar12._4_4_ + fVar125;
          fVar126 = local_fe0._8_4_;
          auVar81._8_4_ = auVar12._8_4_ + fVar126;
          auVar79._0_4_ = local_fe0._12_4_;
          auVar81._12_4_ = auVar12._12_4_ + auVar79._0_4_;
          fVar130 = local_fe0._16_4_;
          auVar81._16_4_ = auVar12._16_4_ + fVar130;
          fVar131 = local_fe0._20_4_;
          auVar81._20_4_ = auVar12._20_4_ + fVar131;
          fVar132 = local_fe0._24_4_;
          auVar81._24_4_ = auVar12._24_4_ + fVar132;
          auVar67._0_4_ = local_fe0._28_4_;
          auVar81._28_4_ = auVar12._28_4_ + auVar67._0_4_;
          auVar13._4_4_ = local_1020._4_4_ * auVar64._4_4_;
          auVar13._0_4_ = local_1020._0_4_ * auVar64._0_4_;
          auVar13._8_4_ = local_1020._8_4_ * auVar64._8_4_;
          auVar13._12_4_ = local_1020._12_4_ * auVar64._12_4_;
          auVar13._16_4_ = local_1020._16_4_ * auVar64._16_4_;
          auVar13._20_4_ = local_1020._20_4_ * auVar64._20_4_;
          auVar13._24_4_ = local_1020._24_4_ * auVar64._24_4_;
          auVar13._28_4_ = uVar47;
          auVar86 = vfmsub231ps_fma(auVar13,local_1040,auVar81);
          auVar16._4_4_ = local_1000._4_4_ * auVar81._4_4_;
          auVar16._0_4_ = local_1000._0_4_ * auVar81._0_4_;
          auVar16._8_4_ = local_1000._8_4_ * auVar81._8_4_;
          auVar16._12_4_ = local_1000._12_4_ * auVar81._12_4_;
          auVar16._16_4_ = local_1000._16_4_ * auVar81._16_4_;
          auVar16._20_4_ = local_1000._20_4_ * auVar81._20_4_;
          auVar16._24_4_ = local_1000._24_4_ * auVar81._24_4_;
          auVar16._28_4_ = auVar81._28_4_;
          auVar78 = vfmsub231ps_fma(auVar16,local_1020,auVar49);
          auVar17._4_4_ = auVar49._4_4_ * local_1040._4_4_;
          auVar17._0_4_ = auVar49._0_4_ * local_1040._0_4_;
          auVar17._8_4_ = auVar49._8_4_ * local_1040._8_4_;
          auVar17._12_4_ = auVar49._12_4_ * local_1040._12_4_;
          auVar17._16_4_ = auVar49._16_4_ * local_1040._16_4_;
          auVar17._20_4_ = auVar49._20_4_ * local_1040._20_4_;
          auVar17._24_4_ = auVar49._24_4_ * local_1040._24_4_;
          auVar17._28_4_ = auVar49._28_4_;
          auVar54 = vfmsub231ps_fma(auVar17,local_1000,auVar64);
          uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          local_1500._4_4_ = uVar47;
          local_1500._0_4_ = uVar47;
          local_1500._8_4_ = uVar47;
          local_1500._12_4_ = uVar47;
          local_1500._16_4_ = uVar47;
          local_1500._20_4_ = uVar47;
          local_1500._24_4_ = uVar47;
          local_1500._28_4_ = uVar47;
          local_14a0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar18._4_4_ = local_14a0._4_4_ * auVar54._4_4_;
          auVar18._0_4_ = local_14a0._4_4_ * auVar54._0_4_;
          auVar18._8_4_ = local_14a0._4_4_ * auVar54._8_4_;
          auVar18._12_4_ = local_14a0._4_4_ * auVar54._12_4_;
          auVar18._16_4_ = local_14a0._4_4_ * 0.0;
          auVar18._20_4_ = local_14a0._4_4_ * 0.0;
          auVar18._24_4_ = local_14a0._4_4_ * 0.0;
          auVar18._28_4_ = local_1020._28_4_;
          auVar78 = vfmadd231ps_fma(auVar18,local_1500,ZEXT1632(auVar78));
          uVar47 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar109._4_4_ = uVar47;
          auVar109._0_4_ = uVar47;
          auVar109._8_4_ = uVar47;
          auVar109._12_4_ = uVar47;
          auVar109._16_4_ = uVar47;
          auVar109._20_4_ = uVar47;
          auVar109._24_4_ = uVar47;
          auVar109._28_4_ = uVar47;
          local_1300 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar109,ZEXT1632(auVar86));
          local_1060 = vsubps_avx(local_1400,auVar51);
          local_1080 = vsubps_avx(local_fe0,auVar74);
          auVar65._0_4_ = local_1400._0_4_ + auVar51._0_4_;
          auVar65._4_4_ = local_1400._4_4_ + auVar51._4_4_;
          auVar65._8_4_ = local_1400._8_4_ + auVar51._8_4_;
          auVar65._12_4_ = local_1400._12_4_ + auVar51._12_4_;
          auVar65._16_4_ = local_1400._16_4_ + auVar51._16_4_;
          auVar65._20_4_ = local_1400._20_4_ + auVar51._20_4_;
          auVar65._24_4_ = local_1400._24_4_ + auVar51._24_4_;
          auVar65._28_4_ = local_1400._28_4_ + auVar51._28_4_;
          auVar82._0_4_ = auVar74._0_4_ + fVar124;
          auVar82._4_4_ = auVar74._4_4_ + fVar125;
          auVar82._8_4_ = auVar74._8_4_ + fVar126;
          auVar82._12_4_ = auVar74._12_4_ + auVar79._0_4_;
          auVar82._16_4_ = auVar74._16_4_ + fVar130;
          auVar82._20_4_ = auVar74._20_4_ + fVar131;
          auVar82._24_4_ = auVar74._24_4_ + fVar132;
          auVar82._28_4_ = auVar74._28_4_ + auVar67._0_4_;
          fVar75 = local_1080._0_4_;
          fVar76 = local_1080._4_4_;
          auVar19._4_4_ = auVar65._4_4_ * fVar76;
          auVar19._0_4_ = auVar65._0_4_ * fVar75;
          fVar85 = local_1080._8_4_;
          auVar19._8_4_ = auVar65._8_4_ * fVar85;
          fVar94 = local_1080._12_4_;
          auVar19._12_4_ = auVar65._12_4_ * fVar94;
          fVar96 = local_1080._16_4_;
          auVar19._16_4_ = auVar65._16_4_ * fVar96;
          fVar98 = local_1080._20_4_;
          auVar19._20_4_ = auVar65._20_4_ * fVar98;
          fVar10 = local_1080._24_4_;
          auVar19._24_4_ = auVar65._24_4_ * fVar10;
          auVar19._28_4_ = auVar67._0_4_;
          auVar86 = vfmsub231ps_fma(auVar19,local_1060,auVar82);
          local_10a0 = vsubps_avx(local_13e0,auVar50);
          fVar133 = local_10a0._0_4_;
          fVar135 = local_10a0._4_4_;
          auVar20._4_4_ = fVar135 * auVar82._4_4_;
          auVar20._0_4_ = fVar133 * auVar82._0_4_;
          fVar136 = local_10a0._8_4_;
          auVar20._8_4_ = fVar136 * auVar82._8_4_;
          fVar137 = local_10a0._12_4_;
          auVar20._12_4_ = fVar137 * auVar82._12_4_;
          fVar138 = local_10a0._16_4_;
          auVar20._16_4_ = fVar138 * auVar82._16_4_;
          fVar139 = local_10a0._20_4_;
          auVar20._20_4_ = fVar139 * auVar82._20_4_;
          fVar140 = local_10a0._24_4_;
          auVar20._24_4_ = fVar140 * auVar82._24_4_;
          auVar20._28_4_ = auVar82._28_4_;
          auVar112._0_4_ = local_13e0._0_4_ + auVar50._0_4_;
          auVar112._4_4_ = local_13e0._4_4_ + auVar50._4_4_;
          auVar112._8_4_ = local_13e0._8_4_ + auVar50._8_4_;
          auVar112._12_4_ = local_13e0._12_4_ + auVar50._12_4_;
          auVar112._16_4_ = local_13e0._16_4_ + auVar50._16_4_;
          auVar112._20_4_ = local_13e0._20_4_ + auVar50._20_4_;
          auVar112._24_4_ = local_13e0._24_4_ + auVar50._24_4_;
          auVar112._28_4_ = local_13e0._28_4_ + auVar50._28_4_;
          auVar78 = vfmsub231ps_fma(auVar20,local_1080,auVar112);
          auVar67._0_4_ = local_1060._0_4_;
          fVar77 = local_1060._4_4_;
          auVar21._4_4_ = auVar112._4_4_ * fVar77;
          auVar21._0_4_ = auVar112._0_4_ * auVar67._0_4_;
          fVar93 = local_1060._8_4_;
          auVar21._8_4_ = auVar112._8_4_ * fVar93;
          fVar95 = local_1060._12_4_;
          auVar21._12_4_ = auVar112._12_4_ * fVar95;
          fVar97 = local_1060._16_4_;
          auVar21._16_4_ = auVar112._16_4_ * fVar97;
          fVar9 = local_1060._20_4_;
          auVar21._20_4_ = auVar112._20_4_ * fVar9;
          fVar11 = local_1060._24_4_;
          auVar21._24_4_ = auVar112._24_4_ * fVar11;
          auVar21._28_4_ = auVar112._28_4_;
          auVar54 = vfmsub231ps_fma(auVar21,local_10a0,auVar65);
          auVar22._4_4_ = local_14a0._4_4_ * auVar54._4_4_;
          auVar22._0_4_ = local_14a0._4_4_ * auVar54._0_4_;
          auVar22._8_4_ = local_14a0._4_4_ * auVar54._8_4_;
          auVar22._12_4_ = local_14a0._4_4_ * auVar54._12_4_;
          auVar22._16_4_ = local_14a0._4_4_ * 0.0;
          auVar22._20_4_ = local_14a0._4_4_ * 0.0;
          auVar22._24_4_ = local_14a0._4_4_ * 0.0;
          auVar22._28_4_ = auVar65._28_4_;
          auVar78 = vfmadd231ps_fma(auVar22,local_1500,ZEXT1632(auVar78));
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar109,ZEXT1632(auVar86));
          auVar13 = vsubps_avx(auVar50,auVar14);
          auVar72._0_4_ = auVar14._0_4_ + auVar50._0_4_;
          auVar72._4_4_ = auVar14._4_4_ + auVar50._4_4_;
          auVar72._8_4_ = auVar14._8_4_ + auVar50._8_4_;
          auVar72._12_4_ = auVar14._12_4_ + auVar50._12_4_;
          auVar72._16_4_ = auVar14._16_4_ + auVar50._16_4_;
          auVar72._20_4_ = auVar14._20_4_ + auVar50._20_4_;
          auVar72._24_4_ = auVar14._24_4_ + auVar50._24_4_;
          auVar72._28_4_ = auVar14._28_4_ + auVar50._28_4_;
          auVar14 = vsubps_avx(auVar51,auVar63);
          auVar92._0_4_ = auVar51._0_4_ + auVar63._0_4_;
          auVar92._4_4_ = auVar51._4_4_ + auVar63._4_4_;
          auVar92._8_4_ = auVar51._8_4_ + auVar63._8_4_;
          auVar92._12_4_ = auVar51._12_4_ + auVar63._12_4_;
          auVar92._16_4_ = auVar51._16_4_ + auVar63._16_4_;
          auVar92._20_4_ = auVar51._20_4_ + auVar63._20_4_;
          auVar92._24_4_ = auVar51._24_4_ + auVar63._24_4_;
          auVar92._28_4_ = auVar51._28_4_ + auVar63._28_4_;
          auVar63 = vsubps_avx(auVar74,auVar12);
          auVar56._0_4_ = auVar74._0_4_ + auVar12._0_4_;
          auVar56._4_4_ = auVar74._4_4_ + auVar12._4_4_;
          auVar56._8_4_ = auVar74._8_4_ + auVar12._8_4_;
          auVar56._12_4_ = auVar74._12_4_ + auVar12._12_4_;
          auVar56._16_4_ = auVar74._16_4_ + auVar12._16_4_;
          auVar56._20_4_ = auVar74._20_4_ + auVar12._20_4_;
          auVar56._24_4_ = auVar74._24_4_ + auVar12._24_4_;
          auVar56._28_4_ = auVar74._28_4_ + auVar12._28_4_;
          auVar100._0_4_ = auVar63._0_4_ * auVar92._0_4_;
          auVar100._4_4_ = auVar63._4_4_ * auVar92._4_4_;
          auVar100._8_4_ = auVar63._8_4_ * auVar92._8_4_;
          auVar100._12_4_ = auVar63._12_4_ * auVar92._12_4_;
          auVar100._16_4_ = auVar63._16_4_ * auVar92._16_4_;
          auVar100._20_4_ = auVar63._20_4_ * auVar92._20_4_;
          auVar100._24_4_ = auVar63._24_4_ * auVar92._24_4_;
          auVar100._28_4_ = 0;
          auVar54 = vfmsub231ps_fma(auVar100,auVar14,auVar56);
          auVar74._4_4_ = auVar56._4_4_ * auVar13._4_4_;
          auVar74._0_4_ = auVar56._0_4_ * auVar13._0_4_;
          auVar74._8_4_ = auVar56._8_4_ * auVar13._8_4_;
          auVar74._12_4_ = auVar56._12_4_ * auVar13._12_4_;
          auVar74._16_4_ = auVar56._16_4_ * auVar13._16_4_;
          auVar74._20_4_ = auVar56._20_4_ * auVar13._20_4_;
          auVar74._24_4_ = auVar56._24_4_ * auVar13._24_4_;
          auVar74._28_4_ = auVar56._28_4_;
          auVar86 = vfmsub231ps_fma(auVar74,auVar63,auVar72);
          auVar12._4_4_ = auVar14._4_4_ * auVar72._4_4_;
          auVar12._0_4_ = auVar14._0_4_ * auVar72._0_4_;
          auVar12._8_4_ = auVar14._8_4_ * auVar72._8_4_;
          auVar12._12_4_ = auVar14._12_4_ * auVar72._12_4_;
          auVar12._16_4_ = auVar14._16_4_ * auVar72._16_4_;
          auVar12._20_4_ = auVar14._20_4_ * auVar72._20_4_;
          auVar12._24_4_ = auVar14._24_4_ * auVar72._24_4_;
          auVar12._28_4_ = auVar72._28_4_;
          auVar59 = vfmsub231ps_fma(auVar12,auVar13,auVar92);
          local_14a0._0_4_ = local_14a0._4_4_;
          fStack_1498 = local_14a0._4_4_;
          fStack_1494 = local_14a0._4_4_;
          fStack_1490 = local_14a0._4_4_;
          fStack_148c = local_14a0._4_4_;
          fStack_1488 = local_14a0._4_4_;
          fStack_1484 = local_14a0._4_4_;
          auVar73._0_4_ = local_14a0._4_4_ * auVar59._0_4_;
          auVar73._4_4_ = local_14a0._4_4_ * auVar59._4_4_;
          auVar73._8_4_ = local_14a0._4_4_ * auVar59._8_4_;
          auVar73._12_4_ = local_14a0._4_4_ * auVar59._12_4_;
          auVar73._16_4_ = local_14a0._4_4_ * 0.0;
          auVar73._20_4_ = local_14a0._4_4_ * 0.0;
          auVar73._24_4_ = local_14a0._4_4_ * 0.0;
          auVar73._28_4_ = 0;
          auVar86 = vfmadd231ps_fma(auVar73,local_1500,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar109,ZEXT1632(auVar54));
          local_12c0 = ZEXT1632(CONCAT412(auVar86._12_4_ + local_1300._12_4_ + auVar78._12_4_,
                                          CONCAT48(auVar86._8_4_ + local_1300._8_4_ + auVar78._8_4_,
                                                   CONCAT44(auVar86._4_4_ +
                                                            local_1300._4_4_ + auVar78._4_4_,
                                                            auVar86._0_4_ +
                                                            local_1300._0_4_ + auVar78._0_4_))));
          auVar57._8_4_ = 0x7fffffff;
          auVar57._0_8_ = 0x7fffffff7fffffff;
          auVar57._12_4_ = 0x7fffffff;
          auVar57._16_4_ = 0x7fffffff;
          auVar57._20_4_ = 0x7fffffff;
          auVar57._24_4_ = 0x7fffffff;
          auVar57._28_4_ = 0x7fffffff;
          local_1520 = ZEXT1632(local_1300);
          auVar50 = vminps_avx(local_1520,ZEXT1632(auVar78));
          auVar50 = vminps_avx(auVar50,ZEXT1632(auVar86));
          local_10e0 = vandps_avx(local_12c0,auVar57);
          fVar99 = local_10e0._0_4_ * 1.1920929e-07;
          fVar102 = local_10e0._4_4_ * 1.1920929e-07;
          auVar23._4_4_ = fVar102;
          auVar23._0_4_ = fVar99;
          fVar103 = local_10e0._8_4_ * 1.1920929e-07;
          auVar23._8_4_ = fVar103;
          fVar104 = local_10e0._12_4_ * 1.1920929e-07;
          auVar23._12_4_ = fVar104;
          fVar105 = local_10e0._16_4_ * 1.1920929e-07;
          auVar23._16_4_ = fVar105;
          fVar106 = local_10e0._20_4_ * 1.1920929e-07;
          auVar23._20_4_ = fVar106;
          fVar107 = local_10e0._24_4_ * 1.1920929e-07;
          auVar23._24_4_ = fVar107;
          auVar23._28_4_ = 0x34000000;
          auVar113._0_8_ = CONCAT44(fVar102,fVar99) ^ 0x8000000080000000;
          auVar113._8_4_ = -fVar103;
          auVar113._12_4_ = -fVar104;
          auVar113._16_4_ = -fVar105;
          auVar113._20_4_ = -fVar106;
          auVar113._24_4_ = -fVar107;
          auVar113._28_4_ = 0xb4000000;
          auVar50 = vcmpps_avx(auVar50,auVar113,5);
          local_10c0 = ZEXT1632(auVar78);
          auVar74 = vmaxps_avx(local_1520,local_10c0);
          auVar51 = vmaxps_avx(auVar74,ZEXT1632(auVar86));
          auVar51 = vcmpps_avx(auVar51,auVar23,2);
          auVar51 = vorps_avx(auVar50,auVar51);
          if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar51 >> 0x7f,0) != '\0') ||
                (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar51 >> 0xbf,0) != '\0') ||
              (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar51[0x1f] < '\0') {
            local_1100 = 0x80000000;
            uStack_10fc = 0x80000000;
            uStack_10f8 = 0x80000000;
            uStack_10f4 = 0x80000000;
            uStack_10f0 = 0x80000000;
            uStack_10ec = 0x80000000;
            uStack_10e8 = 0x80000000;
            uStack_10e4 = 0x80000000;
            auVar24._4_4_ = fVar77 * local_1020._4_4_;
            auVar24._0_4_ = auVar67._0_4_ * local_1020._0_4_;
            auVar24._8_4_ = fVar93 * local_1020._8_4_;
            auVar24._12_4_ = fVar95 * local_1020._12_4_;
            auVar24._16_4_ = fVar97 * local_1020._16_4_;
            auVar24._20_4_ = fVar9 * local_1020._20_4_;
            auVar24._24_4_ = fVar11 * local_1020._24_4_;
            auVar24._28_4_ = auVar50._28_4_;
            auVar25._4_4_ = local_1040._4_4_ * fVar135;
            auVar25._0_4_ = local_1040._0_4_ * fVar133;
            auVar25._8_4_ = local_1040._8_4_ * fVar136;
            auVar25._12_4_ = local_1040._12_4_ * fVar137;
            auVar25._16_4_ = local_1040._16_4_ * fVar138;
            auVar25._20_4_ = local_1040._20_4_ * fVar139;
            auVar25._24_4_ = local_1040._24_4_ * fVar140;
            auVar25._28_4_ = auVar74._28_4_;
            auVar86 = vfmsub213ps_fma(local_1040,local_1080,auVar24);
            auVar26._4_4_ = fVar76 * auVar14._4_4_;
            auVar26._0_4_ = fVar75 * auVar14._0_4_;
            auVar26._8_4_ = fVar85 * auVar14._8_4_;
            auVar26._12_4_ = fVar94 * auVar14._12_4_;
            auVar26._16_4_ = fVar96 * auVar14._16_4_;
            auVar26._20_4_ = fVar98 * auVar14._20_4_;
            auVar26._24_4_ = fVar10 * auVar14._24_4_;
            auVar26._28_4_ = 0x34000000;
            auVar120._0_4_ = fVar133 * auVar63._0_4_;
            auVar120._4_4_ = fVar135 * auVar63._4_4_;
            auVar120._8_4_ = fVar136 * auVar63._8_4_;
            auVar120._12_4_ = fVar137 * auVar63._12_4_;
            auVar120._16_4_ = fVar138 * auVar63._16_4_;
            auVar120._20_4_ = fVar139 * auVar63._20_4_;
            auVar120._24_4_ = fVar140 * auVar63._24_4_;
            auVar120._28_4_ = 0;
            auVar54 = vfmsub213ps_fma(auVar63,local_1060,auVar26);
            auVar50 = vandps_avx(auVar24,auVar57);
            auVar74 = vandps_avx(auVar26,auVar57);
            auVar50 = vcmpps_avx(auVar50,auVar74,1);
            local_12a0 = vblendvps_avx(ZEXT1632(auVar54),ZEXT1632(auVar86),auVar50);
            auVar27._4_4_ = fVar77 * auVar13._4_4_;
            auVar27._0_4_ = auVar67._0_4_ * auVar13._0_4_;
            auVar27._8_4_ = fVar93 * auVar13._8_4_;
            auVar27._12_4_ = fVar95 * auVar13._12_4_;
            auVar27._16_4_ = fVar97 * auVar13._16_4_;
            auVar27._20_4_ = fVar9 * auVar13._20_4_;
            auVar27._24_4_ = fVar11 * auVar13._24_4_;
            auVar27._28_4_ = auVar50._28_4_;
            auVar86 = vfmsub213ps_fma(auVar13,local_1080,auVar120);
            auVar28._4_4_ = local_1000._4_4_ * fVar76;
            auVar28._0_4_ = local_1000._0_4_ * fVar75;
            auVar28._8_4_ = local_1000._8_4_ * fVar85;
            auVar28._12_4_ = local_1000._12_4_ * fVar94;
            auVar28._16_4_ = local_1000._16_4_ * fVar96;
            auVar28._20_4_ = local_1000._20_4_ * fVar98;
            auVar28._24_4_ = local_1000._24_4_ * fVar10;
            auVar28._28_4_ = auVar74._28_4_;
            auVar54 = vfmsub213ps_fma(local_1020,local_10a0,auVar28);
            auVar50 = vandps_avx(auVar28,auVar57);
            auVar74 = vandps_avx(auVar120,auVar57);
            auVar50 = vcmpps_avx(auVar50,auVar74,1);
            local_1280 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar54),auVar50);
            auVar86 = vfmsub213ps_fma(local_1000,local_1060,auVar25);
            auVar54 = vfmsub213ps_fma(auVar14,local_10a0,auVar27);
            auVar50 = vandps_avx(auVar25,auVar57);
            auVar74 = vandps_avx(auVar27,auVar57);
            auVar74 = vcmpps_avx(auVar50,auVar74,1);
            local_1260 = vblendvps_avx(ZEXT1632(auVar54),ZEXT1632(auVar86),auVar74);
            auVar86 = vpackssdw_avx(auVar51._0_16_,auVar51._16_16_);
            fVar85 = local_1260._0_4_;
            fVar93 = local_1260._4_4_;
            auVar14._4_4_ = fVar93 * local_14a0._4_4_;
            auVar14._0_4_ = fVar85 * local_14a0._4_4_;
            fVar94 = local_1260._8_4_;
            auVar14._8_4_ = fVar94 * local_14a0._4_4_;
            fVar95 = local_1260._12_4_;
            auVar14._12_4_ = fVar95 * local_14a0._4_4_;
            fVar96 = local_1260._16_4_;
            auVar14._16_4_ = fVar96 * local_14a0._4_4_;
            fVar97 = local_1260._20_4_;
            auVar14._20_4_ = fVar97 * local_14a0._4_4_;
            fVar98 = local_1260._24_4_;
            auVar14._24_4_ = fVar98 * local_14a0._4_4_;
            auVar14._28_4_ = auVar51._28_4_;
            auVar54 = vfmadd213ps_fma(local_1500,local_1280,auVar14);
            auVar54 = vfmadd213ps_fma(auVar109,local_12a0,ZEXT1632(auVar54));
            auVar67._0_4_ = auVar54._0_4_ + auVar54._0_4_;
            fVar75 = auVar54._4_4_ + auVar54._4_4_;
            fVar76 = auVar54._8_4_ + auVar54._8_4_;
            fVar77 = auVar54._12_4_ + auVar54._12_4_;
            auVar74 = ZEXT1632(CONCAT412(fVar77,CONCAT48(fVar76,CONCAT44(fVar75,auVar67._0_4_))));
            auVar29._4_4_ = fVar93 * fVar125;
            auVar29._0_4_ = fVar85 * fVar124;
            auVar29._8_4_ = fVar94 * fVar126;
            auVar29._12_4_ = fVar95 * auVar79._0_4_;
            auVar29._16_4_ = fVar96 * fVar130;
            auVar29._20_4_ = fVar97 * fVar131;
            auVar29._24_4_ = fVar98 * fVar132;
            auVar29._28_4_ = auVar50._28_4_;
            auVar54 = vfmadd213ps_fma(local_1400,local_1280,auVar29);
            auVar59 = vfmadd213ps_fma(local_13e0,local_12a0,ZEXT1632(auVar54));
            auVar50 = vrcpps_avx(auVar74);
            auVar123._8_4_ = 0x3f800000;
            auVar123._0_8_ = 0x3f8000003f800000;
            auVar123._12_4_ = 0x3f800000;
            auVar123._16_4_ = 0x3f800000;
            auVar123._20_4_ = 0x3f800000;
            auVar123._24_4_ = 0x3f800000;
            auVar123._28_4_ = 0x3f800000;
            auVar54 = vfnmadd213ps_fma(auVar50,auVar74,auVar123);
            auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar50,auVar50);
            local_11e0 = ZEXT1632(CONCAT412((auVar59._12_4_ + auVar59._12_4_) * auVar54._12_4_,
                                            CONCAT48((auVar59._8_4_ + auVar59._8_4_) * auVar54._8_4_
                                                     ,CONCAT44((auVar59._4_4_ + auVar59._4_4_) *
                                                               auVar54._4_4_,
                                                               (auVar59._0_4_ + auVar59._0_4_) *
                                                               auVar54._0_4_))));
            auVar53 = ZEXT3264(local_11e0);
            uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar83._4_4_ = uVar47;
            auVar83._0_4_ = uVar47;
            auVar83._8_4_ = uVar47;
            auVar83._12_4_ = uVar47;
            auVar83._16_4_ = uVar47;
            auVar83._20_4_ = uVar47;
            auVar83._24_4_ = uVar47;
            auVar83._28_4_ = uVar47;
            auVar50 = vcmpps_avx(auVar83,local_11e0,2);
            fVar124 = (ray->super_RayK<1>).tfar;
            auVar114._4_4_ = fVar124;
            auVar114._0_4_ = fVar124;
            auVar114._8_4_ = fVar124;
            auVar114._12_4_ = fVar124;
            auVar114._16_4_ = fVar124;
            auVar114._20_4_ = fVar124;
            auVar114._24_4_ = fVar124;
            auVar114._28_4_ = fVar124;
            auVar51 = vcmpps_avx(local_11e0,auVar114,2);
            auVar50 = vandps_avx(auVar51,auVar50);
            auVar115._0_8_ = CONCAT44(fVar75,auVar67._0_4_) ^ 0x8000000080000000;
            auVar115._8_4_ = -fVar76;
            auVar115._12_4_ = -fVar77;
            auVar115._16_4_ = 0x80000000;
            auVar115._20_4_ = 0x80000000;
            auVar115._24_4_ = 0x80000000;
            auVar115._28_4_ = 0x80000000;
            auVar51 = vcmpps_avx(auVar115,auVar74,4);
            auVar50 = vandps_avx(auVar50,auVar51);
            auVar54 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
            auVar86 = vpand_avx(auVar54,auVar86);
            local_1240 = vpmovsxwd_avx2(auVar86);
            if ((((((((local_1240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1240 >> 0x7f,0) != '\0') ||
                  (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_1240 >> 0xbf,0) != '\0') ||
                (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_1240[0x1f] < '\0') {
              uStack_12f0 = 0;
              uStack_12ec = 0;
              uStack_12e8 = 0;
              uStack_12e4 = 0;
              local_12e0 = local_10c0;
              auVar50 = vrcpps_avx(local_12c0);
              auVar116._8_4_ = 0x3f800000;
              auVar116._0_8_ = 0x3f8000003f800000;
              auVar116._12_4_ = 0x3f800000;
              auVar116._16_4_ = 0x3f800000;
              auVar116._20_4_ = 0x3f800000;
              auVar116._24_4_ = 0x3f800000;
              auVar116._28_4_ = 0x3f800000;
              auVar54 = vfnmadd213ps_fma(local_12c0,auVar50,auVar116);
              auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar50,auVar50);
              auVar84._8_4_ = 0x219392ef;
              auVar84._0_8_ = 0x219392ef219392ef;
              auVar84._12_4_ = 0x219392ef;
              auVar84._16_4_ = 0x219392ef;
              auVar84._20_4_ = 0x219392ef;
              auVar84._24_4_ = 0x219392ef;
              auVar84._28_4_ = 0x219392ef;
              auVar50 = vcmpps_avx(local_10e0,auVar84,5);
              auVar50 = vandps_avx(auVar50,ZEXT1632(auVar54));
              local_1160 = local_1120;
              auVar30._4_4_ = local_1300._4_4_ * auVar50._4_4_;
              auVar30._0_4_ = local_1300._0_4_ * auVar50._0_4_;
              auVar30._8_4_ = local_1300._8_4_ * auVar50._8_4_;
              auVar30._12_4_ = local_1300._12_4_ * auVar50._12_4_;
              auVar30._16_4_ = auVar50._16_4_ * 0.0;
              auVar30._20_4_ = auVar50._20_4_ * 0.0;
              auVar30._24_4_ = auVar50._24_4_ * 0.0;
              auVar30._28_4_ = 0;
              auVar51 = vminps_avx(auVar30,auVar116);
              auVar31._4_4_ = auVar78._4_4_ * auVar50._4_4_;
              auVar31._0_4_ = auVar78._0_4_ * auVar50._0_4_;
              auVar31._8_4_ = auVar78._8_4_ * auVar50._8_4_;
              auVar31._12_4_ = auVar78._12_4_ * auVar50._12_4_;
              auVar31._16_4_ = auVar50._16_4_ * 0.0;
              auVar31._20_4_ = auVar50._20_4_ * 0.0;
              auVar31._24_4_ = auVar50._24_4_ * 0.0;
              auVar31._28_4_ = 0;
              auVar50 = vminps_avx(auVar31,auVar116);
              auVar74 = vsubps_avx(auVar116,auVar51);
              local_1200 = vblendvps_avx(auVar50,auVar74,local_1120);
              auVar50 = vsubps_avx(auVar116,auVar50);
              local_1220 = vblendvps_avx(auVar51,auVar50,local_1120);
              local_11c0[0] = local_12a0._0_4_ * (float)local_1140._0_4_;
              local_11c0[1] = local_12a0._4_4_ * (float)local_1140._4_4_;
              local_11c0[2] = local_12a0._8_4_ * fStack_1138;
              local_11c0[3] = local_12a0._12_4_ * fStack_1134;
              fStack_11b0 = local_12a0._16_4_ * fStack_1130;
              fStack_11ac = local_12a0._20_4_ * fStack_112c;
              fStack_11a8 = local_12a0._24_4_ * fStack_1128;
              uStack_11a4 = local_1220._28_4_;
              local_11a0[0] = (float)local_1140._0_4_ * local_1280._0_4_;
              local_11a0[1] = (float)local_1140._4_4_ * local_1280._4_4_;
              local_11a0[2] = fStack_1138 * local_1280._8_4_;
              local_11a0[3] = fStack_1134 * local_1280._12_4_;
              fStack_1190 = fStack_1130 * local_1280._16_4_;
              fStack_118c = fStack_112c * local_1280._20_4_;
              fStack_1188 = fStack_1128 * local_1280._24_4_;
              uStack_1184 = auVar50._28_4_;
              auVar50 = vpmovzxwd_avx2(auVar86);
              auVar50 = vpslld_avx2(auVar50,0x1f);
              auVar66._8_4_ = 0x7f800000;
              auVar66._0_8_ = 0x7f8000007f800000;
              auVar66._12_4_ = 0x7f800000;
              auVar66._16_4_ = 0x7f800000;
              auVar66._20_4_ = 0x7f800000;
              auVar66._24_4_ = 0x7f800000;
              auVar66._28_4_ = 0x7f800000;
              auVar50 = vblendvps_avx(auVar66,local_11e0,auVar50);
              local_1180[0] = (float)local_1140._0_4_ * fVar85;
              local_1180[1] = (float)local_1140._4_4_ * fVar93;
              local_1180[2] = fStack_1138 * fVar94;
              local_1180[3] = fStack_1134 * fVar95;
              fStack_1170 = fStack_1130 * fVar96;
              fStack_116c = fStack_112c * fVar97;
              fStack_1168 = fStack_1128 * fVar98;
              uStack_1164 = uStack_1124;
              auVar51 = vshufps_avx(auVar50,auVar50,0xb1);
              auVar51 = vminps_avx(auVar50,auVar51);
              auVar74 = vshufpd_avx(auVar51,auVar51,5);
              auVar51 = vminps_avx(auVar51,auVar74);
              auVar74 = vpermpd_avx2(auVar51,0x4e);
              auVar51 = vminps_avx(auVar51,auVar74);
              auVar50 = vcmpps_avx(auVar50,auVar51,0);
              auVar78 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
              auVar78 = vpand_avx(auVar78,auVar86);
              auVar50 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar101 = ZEXT3264(auVar50);
              local_1440 = local_1240;
              auVar51 = vpmovzxwd_avx2(auVar78);
              auVar51 = vpslld_avx2(auVar51,0x1f);
              if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar51 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar51 >> 0x7f,0) == '\0') &&
                    (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar51 >> 0xbf,0) == '\0') &&
                  (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar51[0x1f]) {
                auVar51 = local_1240;
              }
              uVar33 = vextractps_avx(auVar50._0_16_,1);
              uVar35 = vmovmskps_avx(auVar51);
              uVar36 = 0;
              for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
                uVar36 = uVar36 + 1;
              }
              do {
                uVar44 = CONCAT44(0,uVar36);
                local_1458 = *(uint *)((long)&local_fc0 + uVar44 * 4);
                pGVar8 = (pSVar2->geometries).items[local_1458].ptr;
                if ((pGVar8->mask & uVar33) == 0) {
                  *(undefined4 *)(local_1440 + uVar44 * 4) = 0;
                }
                else {
                  local_1500._0_8_ = uVar44;
                  local_14a0 = (byte *)context->args;
                  local_1400 = auVar101._0_32_;
                  if (context->args->filter == (RTCFilterFunctionN)0x0) {
                    local_14d0.context = context->user;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar124 = *(float *)(local_1220 + uVar44 * 4);
                      fVar125 = *(float *)(local_1200 + uVar44 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar44 * 4);
                      (ray->Ng).field_0.field_0.x = local_11c0[uVar44];
                      (ray->Ng).field_0.field_0.y = local_11a0[uVar44];
                      (ray->Ng).field_0.field_0.z = local_1180[uVar44];
                      ray->u = fVar124;
                      ray->v = fVar125;
                      ray->primID = *(uint *)((long)&local_1320 + uVar44 * 4);
                      ray->geomID = local_1458;
                      ray->instID[0] = (local_14d0.context)->instID[0];
                      ray->instPrimID[0] = (local_14d0.context)->instPrimID[0];
                      break;
                    }
                  }
                  else {
                    local_14d0.context = context->user;
                  }
                  local_1470 = local_11c0[uVar44];
                  local_146c = local_11a0[uVar44];
                  local_1468 = local_1180[uVar44];
                  local_1464 = *(undefined4 *)(local_1220 + uVar44 * 4);
                  local_1460 = *(undefined4 *)(local_1200 + uVar44 * 4);
                  local_145c = *(undefined4 *)((long)&local_1320 + uVar44 * 4);
                  local_1454 = (local_14d0.context)->instID[0];
                  local_1450 = (local_14d0.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar44 * 4);
                  local_153c = -1;
                  local_14d0.valid = &local_153c;
                  local_14d0.geometryUserPtr = pGVar8->userPtr;
                  local_14d0.ray = (RTCRayN *)ray;
                  local_14d0.hit = (RTCHitN *)&local_1470;
                  local_14d0.N = 1;
                  local_1520._0_8_ = pGVar8;
                  local_13e0 = auVar53._0_32_;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01491655:
                    if ((*(code **)(local_14a0 + 0x10) != (code *)0x0) &&
                       (((*local_14a0 & 2) != 0 ||
                        ((*(byte *)(local_1520._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (**(code **)(local_14a0 + 0x10))(&local_14d0);
                      auVar53 = ZEXT3264(local_13e0);
                      ray = local_1528;
                      uVar40 = local_1530;
                      uVar41 = local_1538;
                      if (*local_14d0.valid == 0) goto LAB_01491715;
                    }
                    (((Vec3f *)((long)local_14d0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_14d0.hit;
                    (((Vec3f *)((long)local_14d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_14d0.hit + 4);
                    (((Vec3f *)((long)local_14d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_14d0.hit + 8);
                    *(float *)((long)local_14d0.ray + 0x3c) = *(float *)(local_14d0.hit + 0xc);
                    *(float *)((long)local_14d0.ray + 0x40) = *(float *)(local_14d0.hit + 0x10);
                    *(float *)((long)local_14d0.ray + 0x44) = *(float *)(local_14d0.hit + 0x14);
                    *(float *)((long)local_14d0.ray + 0x48) = *(float *)(local_14d0.hit + 0x18);
                    *(float *)((long)local_14d0.ray + 0x4c) = *(float *)(local_14d0.hit + 0x1c);
                    *(float *)((long)local_14d0.ray + 0x50) = *(float *)(local_14d0.hit + 0x20);
                  }
                  else {
                    (*pGVar8->intersectionFilterN)(&local_14d0);
                    auVar53 = ZEXT3264(local_13e0);
                    ray = local_1528;
                    uVar40 = local_1530;
                    uVar41 = local_1538;
                    if (*local_14d0.valid != 0) goto LAB_01491655;
LAB_01491715:
                    (local_1528->super_RayK<1>).tfar = (float)local_1400._0_4_;
                    ray = local_1528;
                    uVar40 = local_1530;
                    uVar41 = local_1538;
                  }
                  *(undefined4 *)(local_1440 + local_1500._0_8_ * 4) = 0;
                  fVar124 = (ray->super_RayK<1>).tfar;
                  auVar52._4_4_ = fVar124;
                  auVar52._0_4_ = fVar124;
                  auVar52._8_4_ = fVar124;
                  auVar52._12_4_ = fVar124;
                  auVar52._16_4_ = fVar124;
                  auVar52._20_4_ = fVar124;
                  auVar52._24_4_ = fVar124;
                  auVar52._28_4_ = fVar124;
                  auVar50 = vcmpps_avx(auVar53._0_32_,auVar52,2);
                  local_1440 = vandps_avx(auVar50,local_1440);
                  uVar33 = (ray->super_RayK<1>).mask;
                  auVar101 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                }
                if ((((((((local_1440 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1440 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1440 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1440 >> 0x7f,0) == '\0') &&
                      (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1440 >> 0xbf,0) == '\0') &&
                    (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1440[0x1f]) break;
                auVar58._8_4_ = 0x7f800000;
                auVar58._0_8_ = 0x7f8000007f800000;
                auVar58._12_4_ = 0x7f800000;
                auVar58._16_4_ = 0x7f800000;
                auVar58._20_4_ = 0x7f800000;
                auVar58._24_4_ = 0x7f800000;
                auVar58._28_4_ = 0x7f800000;
                auVar50 = vblendvps_avx(auVar58,auVar53._0_32_,local_1440);
                auVar51 = vshufps_avx(auVar50,auVar50,0xb1);
                auVar51 = vminps_avx(auVar50,auVar51);
                auVar74 = vshufpd_avx(auVar51,auVar51,5);
                auVar51 = vminps_avx(auVar51,auVar74);
                auVar74 = vpermpd_avx2(auVar51,0x4e);
                auVar51 = vminps_avx(auVar51,auVar74);
                auVar51 = vcmpps_avx(auVar50,auVar51,0);
                auVar74 = local_1440 & auVar51;
                auVar50 = local_1440;
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar74 >> 0x7f,0) != '\0') ||
                      (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0xbf,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar74[0x1f] < '\0') {
                  auVar50 = vandps_avx(auVar51,local_1440);
                }
                uVar35 = vmovmskps_avx(auVar50);
                uVar36 = 0;
                for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
                  uVar36 = uVar36 + 1;
                }
              } while( true );
            }
          }
          auVar110 = ZEXT1664(local_1330);
          auVar117 = ZEXT1664(local_1340);
          auVar121 = ZEXT1664(local_1350);
          auVar127 = ZEXT1664(local_1370);
          auVar128 = ZEXT1664(local_1380);
          auVar134 = ZEXT1664(local_13a0);
          auVar142 = ZEXT1664(local_13b0);
          auVar101 = ZEXT1664(local_1410);
          auVar79._0_4_ = local_1360;
          fVar124 = fStack_135c;
          fVar125 = fStack_1358;
          fVar126 = fStack_1354;
          auVar67._0_4_ = local_1390;
          fVar130 = fStack_138c;
          fVar131 = fStack_1388;
          fVar132 = fStack_1384;
        }
        fVar75 = (ray->super_RayK<1>).tfar;
        auVar53 = ZEXT1664(CONCAT412(fVar75,CONCAT48(fVar75,CONCAT44(fVar75,fVar75))));
      }
      goto LAB_01490acb;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }